

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::file::
Base<njoy::ENDFtk::file::Type<2>,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (Base<njoy::ENDFtk::file::Type<2>,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT)

{
  _Rb_tree_node_base *p_Var1;
  undefined8 *puVar2;
  int local_80;
  int local_7c;
  StructureDivision local_78;
  
  p_Var1 = *(_Rb_tree_node_base **)(this + 0x18);
  if (p_Var1 != (_Rb_tree_node_base *)(this + 8)) {
    do {
      local_80 = 2;
      local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
           (long)&local_7c;
      local_7c = MAT;
      local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
      super__Head_base<5UL,_long,_false>._M_head_impl =
           (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)it;
      local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_80;
      std::
      visit<njoy::ENDFtk::file::Type<2>::printSection<std::back_insert_iterator<std::__cxx11::string>>(std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>const&,std::back_insert_iterator<std::__cxx11::string>&,int,int)::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>const&>
                ((anon_class_24_3_609179f9 *)&local_78,
                 (variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>
                  *)&p_Var1[1]._M_parent);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)(this + 8));
  }
  if (0 < MAT) {
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = 0.0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = 0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
    super__Head_base<5UL,_long,_false>._M_head_impl = (_Head_base<5UL,_long,_false>)0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
    local_78.tail.fields._M_elems[1] = 0;
    local_78.tail.fields._M_elems[2] = 0;
    local_78.tail.fields._M_elems[0] = MAT;
    StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_78,it);
    return;
  }
  tools::Log::error<char_const*>("Illegal material number (MAT) specified in FEND record");
  tools::Log::info<char_const*>("FEND records require a material number greater than 0");
  tools::Log::info<char_const*,int>("Specified material number: {}",MAT);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void print( OutputIterator& it, int MAT ) const {

  int MF = this->MF();
  for ( const auto& entry : this->sections_ ) {

    Derived::printSection( entry.second, it, MAT, MF );
  }
  FEND( MAT ).print( it );
}